

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
           *this,element_type *p,arrays_type *arrays_,size_t *num_destroyed)

{
  undefined1 auVar1 [16];
  ulong hash;
  pair<const_slang::ast::SubroutineSymbol_*&&,_const_slang::syntax::DPIExportSyntax_*&&> local_28;
  locator local_18;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = p->first;
  *num_destroyed = *num_destroyed + 1;
  hash = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar1,8) ^
         SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar1,0);
  local_28.second = &p->second;
  local_28.first = &p->first;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
  ::
  nosize_unchecked_emplace_at<std::pair<slang::ast::SubroutineSymbol_const*&&,slang::syntax::DPIExportSyntax_const*&&>>
            (&local_18,
             (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,&local_28);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, const arrays_type& arrays_,
                                 std::size_t& num_destroyed) {
        nosize_transfer_element(p, hash_for(key_from(*p)), arrays_, num_destroyed,
                                std::integral_constant < bool,
                                std::is_nothrow_move_constructible<init_type>::value ||
                                    !std::is_same<element_type, value_type>::value ||
                                    !std::is_copy_constructible<element_type>::value > {});
    }